

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::slave(Container *this)

{
  size_type sVar1;
  int iVar2;
  Worker *this_00;
  SharedBarrier *this_01;
  ContextManager *pCVar3;
  char *pcVar4;
  size_t i;
  long lVar5;
  string *name;
  TaskData *pTVar6;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"slave",&local_51);
  name = &local_50;
  ContextManager::set(&this->super_ContextManager,name);
  std::__cxx11::string::~string((string *)&local_50);
  reset_sigchld();
  this_00 = Worker::get();
  this_01 = Worker::get_run_start_barrier(this_00);
  SharedBarrier::wait(this_01,name);
  ((this->task_data_).ptr_)->error = false;
  CgroupController::delay_enter(this->memory_controller_);
  CgroupController::delay_enter(this->cpuacct_controller_);
  iVar2 = chdir((this->work_dir_)._M_pathname._M_dataplus._M_p);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_50,"chdir() failed: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar2 = chroot((this->root_)._M_pathname._M_dataplus._M_p);
  if (iVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_50,"chroot() failed: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  open_files(this);
  dup2_fds(this);
  close_all_fds(this);
  setup_rlimits(this);
  setup_credentials(this);
  CgroupController::enter(this->memory_controller_);
  CgroupController::enter(this->cpuacct_controller_);
  pTVar6 = (this->task_data_).ptr_;
  sVar1 = (pTVar6->env).items_.size_;
  lVar5 = 0;
  do {
    if (sVar1 - 1 == lVar5) {
      pcVar4 = getenv("PATH");
      if (pcVar4 != (char *)0x0) {
        format_abi_cxx11_(&local_50,"PATH=%s",pcVar4);
        PlainStringVector<129UL,_5120UL>::add(&pTVar6->env,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pTVar6 = (this->task_data_).ptr_;
      }
      break;
    }
    iVar2 = strcmp(*(char **)((pTVar6->env).items_.data_ + lVar5 * 8),"PATH=");
    lVar5 = lVar5 + 1;
  } while (iVar2 != 0);
  execvpe(*(char **)(pTVar6->argv).items_.data_,(char **)(pTVar6->argv).items_.data_,
          (char **)(pTVar6->env).items_.data_);
  pCVar3 = ContextManager::get();
  format_abi_cxx11_(&local_50,"Failed to execute command \'%s\': %m",
                    *(undefined8 *)(((this->task_data_).ptr_)->argv).items_.data_);
  (**pCVar3->_vptr_ContextManager)(pCVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _exit(-1);
}

Assistant:

void Container::slave() {
    ContextManager::set(this, "slave");
    reset_sigchld();

    Worker::get().get_run_start_barrier()->wait();
    task_data_->error = false;

    memory_controller_->delay_enter();
    cpuacct_controller_->delay_enter();

    if (chdir(work_dir_.c_str()) != 0) {
        die(format("chdir() failed: %m"));
    }

    if (chroot(root_.c_str()) != 0) {
        die(format("chroot() failed: %m"));
    }

    open_files();
    dup2_fds();
    close_all_fds();
    setup_rlimits();
    setup_credentials();

    memory_controller_->enter();
    cpuacct_controller_->enter();

    bool has_path = false;
    for (size_t i = 0; i < task_data_->env.count(); ++i) {
        if (strcmp(task_data_->env[i], "PATH=") == 0) {
            has_path = true;
            break;
        }
    }
    if (!has_path) {
        char *path_env = getenv("PATH");
        if (path_env != nullptr) {
            task_data_->env.add(format("PATH=%s", path_env));
        }
    }

    execvpe(task_data_->argv[0], task_data_->argv.get(), task_data_->env.get());
    die(format("Failed to execute command '%s': %m", task_data_->argv[0]));
    _exit(-1); // we should not get here
}